

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_fstat(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 *puVar1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  jx9_value *pValue_00;
  jx9_value *pjVar5;
  char *local_60;
  io_private *pDev;
  jx9_io_stream *pStream;
  jx9_value *pValue;
  jx9_value *pArray;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar2 = jx9_value_is_resource(*apArg), iVar2 == 0)) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
    jx9_result_bool(pCtx,0);
    return 0;
  }
  plVar3 = (long *)jx9_value_to_resource(*apArg);
  if ((plVar3 == (long *)0x0) || (*(int *)((long)plVar3 + 0x34) != 0xfeac14)) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
    jx9_result_bool(pCtx,0);
    return 0;
  }
  puVar1 = (undefined8 *)*plVar3;
  if ((puVar1 == (undefined8 *)0x0) || (puVar1[0xf] == 0)) {
    pcVar4 = jx9_function_name(pCtx);
    if (puVar1 == (undefined8 *)0x0) {
      local_60 = "null_stream";
    }
    else {
      local_60 = (char *)*puVar1;
    }
    jx9_context_throw_error_format
              (pCtx,2,
               "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
               ,pcVar4,local_60);
    jx9_result_bool(pCtx,0);
    return 0;
  }
  pValue_00 = jx9_context_new_array(pCtx);
  pjVar5 = jx9_context_new_scalar(pCtx);
  if ((pValue_00 != (jx9_value *)0x0) && (pjVar5 != (jx9_value *)0x0)) {
    (*(code *)puVar1[0xf])(plVar3[1],pValue_00,pjVar5);
    jx9_result_value(pCtx,pValue_00);
    return 0;
  }
  jx9_context_throw_error(pCtx,1,"JX9 is running out of memory");
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_fstat(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray, *pValue;
	const jx9_io_stream *pStream;
	io_private *pDev;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/* Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xStat == 0){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Create the array and the working value */
	pArray = jx9_context_new_array(pCtx);
	pValue = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pValue == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	pStream->xStat(pDev->pHandle, pArray, pValue);
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	/* Don't worry about freeing memory here, everything will be
	 * released automatically as soon we return from this function.
	 */
	return JX9_OK;
}